

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryPushJavascriptArray
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int operationSucceeded;
  Var pvVar4;
  undefined4 *puVar5;
  PCWSTR pWVar6;
  uint32 itemIndex;
  undefined1 local_60 [8];
  ThrowTypeErrorOnFailureHelper h;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arr);
  uVar1 = (arr->super_ArrayObject).length;
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940e54;
  local_60 = (undefined1  [8])scriptContext;
  if (uVar1 != 0xffffffff && argCount == 1) {
    operationSucceeded =
         (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                   (arr,(ulong)uVar1,*args,0);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_60,operationSucceeded);
    pvVar4 = JavascriptNumber::ToVar(uVar1 + 1,scriptContext);
    return pvVar4;
  }
  if (argCount < ~uVar1) {
    bVar3 = IsVarArray(arr);
    if ((bVar3) &&
       ((((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr == scriptContext))
    {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      h.m_functionName = (PCWSTR)(ulong)argCount;
      pWVar6 = (PCWSTR)0x0;
      do {
        if (h.m_functionName == pWVar6) {
          pvVar4 = JavascriptNumber::ToVar(uVar1 + (int)pWVar6,scriptContext);
          return pvVar4;
        }
        itemIndex = uVar1 + (int)pWVar6;
        if (itemIndex == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x152f,"(n != JavascriptArray::MaxArrayLength)",
                                      "n != JavascriptArray::MaxArrayLength");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        DirectSetItemAt<void*>(arr,itemIndex,args[(long)pWVar6]);
        pWVar6 = (PCWSTR)((long)pWVar6 + 1);
      } while( true );
    }
  }
  pvVar4 = EntryPushJavascriptArrayNoFastPath(scriptContext,arr,args,argCount);
  return pvVar4;
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArray(ScriptContext * scriptContext, JavascriptArray * arr, Var * args, uint argCount)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arr);
#endif

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // Fast Path for one push for small indexes
        if (argCount == 1 && n < JavascriptArray::MaxArrayLength)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[0], PropertyOperation_None));
            return JavascriptNumber::ToVar(n + 1, scriptContext);
        }

        // Fast Path for multiple push for small indexes
        if (argCount < JavascriptArray::MaxArrayLength - n && JavascriptArray::IsVarArray(arr) && scriptContext == arr->GetScriptContext())
        {
            uint index;
            for (index = 0; index < argCount; ++index, ++n)
            {
                Assert(n != JavascriptArray::MaxArrayLength);
                // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
                arr->JavascriptArray::DirectSetItemAt(n, args[index]);
            }
            return JavascriptNumber::ToVar(n, scriptContext);
        }

        return EntryPushJavascriptArrayNoFastPath(scriptContext, arr, args, argCount);
    }